

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerialQueue.cpp
# Opt level: O0

void __thiscall
SerialExecutionQueue::SerialExecutionQueue
          (SerialExecutionQueue *this,ExecutionQueueDelegate *delegate,char **environment)

{
  result_type rVar1;
  SerialQueueImpl *this_00;
  random_device local_13a8;
  char **local_20;
  char **environment_local;
  ExecutionQueueDelegate *delegate_local;
  SerialExecutionQueue *this_local;
  
  local_20 = environment;
  environment_local = (char **)delegate;
  delegate_local = (ExecutionQueueDelegate *)this;
  llbuild::basic::ExecutionQueue::ExecutionQueue(&this->super_ExecutionQueue,delegate);
  (this->super_ExecutionQueue)._vptr_ExecutionQueue =
       (_func_int **)&PTR__SerialExecutionQueue_0043c378;
  std::random_device::random_device(&local_13a8);
  rVar1 = std::random_device::operator()(&local_13a8);
  std::random_device::~random_device(&local_13a8);
  this->buildID = rVar1;
  this_00 = (SerialQueueImpl *)operator_new(0xb0);
  anon_unknown.dwarf_3da423::SerialQueueImpl::SerialQueueImpl(this_00);
  this->queue = this_00;
  this->environment = local_20;
  this->jobCount = 0;
  std::atomic<bool>::atomic(&this->cancelled,false);
  llbuild::basic::ProcessGroup::ProcessGroup(&this->spawnedProcesses);
  std::mutex::mutex(&this->killAfterTimeoutThreadMutex);
  std::unique_ptr<std::thread,std::default_delete<std::thread>>::
  unique_ptr<std::default_delete<std::thread>,void>
            ((unique_ptr<std::thread,std::default_delete<std::thread>> *)
             &this->killAfterTimeoutThread,(nullptr_t)0x0);
  std::condition_variable::condition_variable(&this->queueCompleteCondition);
  std::mutex::mutex(&this->queueCompleteMutex);
  this->queueComplete = false;
  return;
}

Assistant:

SerialExecutionQueue(ExecutionQueueDelegate& delegate,
                       const char* const* environment)
  : ExecutionQueue(delegate), buildID(std::random_device()()), queue(new SerialQueueImpl), environment(environment)
  {
  }